

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

void makeIntColumns(Matrix<Rational> *m)

{
  Rational *pRVar1;
  compare_t cVar2;
  compare_t cVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  BigInteger g;
  ulong local_130;
  Rational local_110;
  BigInteger local_d0;
  BigInteger local_b0;
  BigInteger local_90;
  BigInteger local_70;
  BigInteger local_50;
  
  if (m->N != 0) {
    local_130 = 0;
    do {
      BigInteger::BigInteger(&local_d0,1);
      uVar5 = 0;
      uVar4 = 0;
      if (m->M != 0) {
        uVar6 = 0;
        uVar4 = 0;
        uVar5 = 0;
        do {
          uVar7 = m->N * uVar6;
          pRVar1 = m->arr;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_110,
                     &pRVar1[uVar7 + local_130]._denominator.digits);
          local_110._numerator.negative = pRVar1[uVar7 + local_130]._denominator.negative;
          BigInteger::BigInteger(&local_90,1);
          cVar2 = BigInteger::_compare(&local_110._numerator,&local_90);
          if (local_90.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_90.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_110._numerator.digits.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_110._numerator.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (cVar2 != CMP_EQUAL) {
            uVar7 = m->N * uVar6;
            pRVar1 = m->arr;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_110,
                       &pRVar1[uVar7 + local_130]._denominator.digits);
            local_110._numerator.negative = pRVar1[uVar7 + local_130]._denominator.negative;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      (&local_b0.digits,&local_d0.digits);
            local_b0.negative = local_d0.negative;
            uVar7 = m->N * uVar6;
            pRVar1 = m->arr;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                      (&local_70.digits,&pRVar1[uVar7 + local_130]._denominator.digits);
            local_70.negative = pRVar1[uVar7 + local_130]._denominator.negative;
            gcd(&local_90,&local_b0,&local_70);
            operator/(&local_50,&local_110._numerator,&local_90);
            BigInteger::operator*=(&local_d0,&local_50);
            if (local_50.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_50.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_90.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_90.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_70.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_70.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_b0.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_b0.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
            if (local_110._numerator.digits.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_110._numerator.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
            }
          }
          uVar7 = m->N;
          pRVar1 = m->arr;
          BigInteger::BigInteger(&local_110._numerator,0);
          BigInteger::BigInteger(&local_110._denominator,1);
          cVar2 = Rational::compare(pRVar1 + uVar7 * uVar6 + local_130,&local_110);
          if (local_110._denominator.digits.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_110._denominator.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_110._numerator.digits.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_110._numerator.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          uVar7 = m->N;
          pRVar1 = m->arr;
          BigInteger::BigInteger(&local_110._numerator,0);
          BigInteger::BigInteger(&local_110._denominator,1);
          cVar3 = Rational::compare(pRVar1 + uVar7 * uVar6 + local_130,&local_110);
          if (local_110._denominator.digits.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_110._denominator.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_110._numerator.digits.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_110._numerator.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          uVar5 = uVar5 + (cVar2 == CMP_GREATER);
          uVar4 = uVar4 + (cVar3 == CMP_LESS);
          uVar6 = uVar6 + 1;
        } while (uVar6 < m->M);
      }
      if (uVar5 < uVar4) {
        BigInteger::operator-(&local_110._numerator,&local_d0);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  (&local_d0.digits,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_110);
        local_d0.negative = local_110._numerator.negative;
        if (local_110._numerator.digits.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_110._numerator.digits.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
      }
      if (m->M != 0) {
        uVar4 = 0;
        do {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_110,
                     &local_d0.digits);
          local_110._numerator.negative = local_d0.negative;
          BigInteger::BigInteger(&local_110._denominator,1);
          Rational::operator*=(m->arr + m->N * uVar4 + local_130,&local_110);
          if (local_110._denominator.digits.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_110._denominator.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          if (local_110._numerator.digits.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_110._numerator.digits.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
          }
          uVar4 = uVar4 + 1;
        } while (uVar4 < m->M);
      }
      if (local_d0.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d0.digits.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_130 = local_130 + 1;
    } while (local_130 < m->N);
  }
  return;
}

Assistant:

void makeIntColumns(Matrix<Rational> &m)
{
    for(unsigned col = 0; col < m.width(); ++col)
    {
        BigInteger g = 1;
        unsigned pos = 0, neg = 0;
        for(unsigned i = 0; i < m.height(); ++i)
        {
            if(m[i][col].denominator() != 1)
                g *= m[i][col].denominator() / gcd(g, m[i][col].denominator());
            pos += m[i][col] > 0;
            neg += m[i][col] < 0;
        }
        if(neg > pos)
            g = -g;
        for(unsigned i = 0; i < m.height(); ++i)
        {
            m[i][col] *= g;
        }
    }
}